

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
chaiscript::boxed_cast<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  undefined8 *puVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  Type_Info local_78;
  pointer_____offset_0x10___ *local_58;
  pointer_____offset_0x10___ *local_50;
  undefined4 local_48;
  
  if (bv != (Boxed_Value *)0x0) {
    local_78.m_type_info = (type_info *)&std::__cxx11::string::typeinfo;
    local_78.m_bare_type_info = (type_info *)&std::__cxx11::string::typeinfo;
    local_78._16_8_ = local_78._16_8_ & 0xffffffff00000000;
    bVar4 = Type_Info::bare_equal(*(Type_Info **)this,&local_78);
    if ((!bVar4) &&
       (bVar4 = Type_Conversions::convertable_type<std::__cxx11::string>
                          ((Type_Conversions *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr), bVar4)) {
      bVar4 = Type_Conversions::convertable_type<std::__cxx11::string>
                        ((Type_Conversions *)
                         (bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (!bVar4) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
        puVar1 = *(undefined8 **)this;
        local_78._16_8_ = puVar1[2];
        ptVar2 = (type_info *)*puVar1;
        ptVar3 = (type_info *)puVar1[1];
        *puVar6 = &PTR__bad_cast_0019ca90;
        local_78.m_type_info._0_4_ = SUB84(ptVar2,0);
        local_78.m_type_info._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
        local_78.m_bare_type_info._0_4_ = SUB84(ptVar3,0);
        local_78.m_bare_type_info._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
        *(undefined4 *)(puVar6 + 1) = local_78.m_type_info._0_4_;
        *(undefined4 *)((long)puVar6 + 0xc) = local_78.m_type_info._4_4_;
        *(undefined4 *)(puVar6 + 2) = local_78.m_bare_type_info._0_4_;
        *(undefined4 *)((long)puVar6 + 0x14) = local_78.m_bare_type_info._4_4_;
        puVar6[3] = local_78._16_8_;
        puVar6[4] = &std::__cxx11::string::typeinfo;
        puVar6[5] = 0x19;
        puVar6[6] = "Cannot perform boxed_cast";
        local_78.m_type_info = ptVar2;
        local_78.m_bare_type_info = ptVar3;
        __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_58 = &std::__cxx11::string::typeinfo;
      local_50 = &std::__cxx11::string::typeinfo;
      local_48 = 0;
      Type_Conversions::boxed_type_conversion
                ((Type_Conversions *)&local_78,
                 &((bv->m_data).
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_type_info,(Conversion_Saves *)&local_58,
                 (Boxed_Value *)
                 (bv->m_data).
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      plVar5 = (long *)detail::verify_type<void>
                                 ((Boxed_Value *)local_78.m_type_info,
                                  (type_info *)&std::__cxx11::string::typeinfo,
                                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                   (local_78.m_type_info + 0x28));
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*plVar5,plVar5[1] + *plVar5);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.m_bare_type_info ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return __return_storage_ptr__;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.m_bare_type_info);
      return __return_storage_ptr__;
    }
  }
  plVar5 = (long *)detail::verify_type<void>
                             (*(Boxed_Value **)this,(type_info *)&std::__cxx11::string::typeinfo,
                              (*(Boxed_Value **)this)[2].m_data.
                              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*plVar5,plVar5[1] + *plVar5);
  return __return_storage_ptr__;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }